

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::UnitTestImpl::RecordProperty(UnitTestImpl *this,TestProperty *test_property)

{
  long in_RDI;
  TestResult *test_result;
  string xml_element;
  TestProperty *in_stack_00000090;
  string *in_stack_00000098;
  TestResult *in_stack_000000a0;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  if (*(long *)(in_RDI + 0x110) == 0) {
    if (*(long *)(in_RDI + 0x108) == 0) {
      std::__cxx11::string::operator=(local_30,"testsuites");
    }
    else {
      std::__cxx11::string::operator=(local_30,"testsuite");
    }
  }
  else {
    std::__cxx11::string::operator=(local_30,"testcase");
  }
  TestResult::RecordProperty(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void UnitTestImpl::RecordProperty(const TestProperty& test_property) {
  std::string xml_element;
  TestResult* test_result;  // TestResult appropriate for property recording.

  if (current_test_info_ != NULL) {
    xml_element = "testcase";
    test_result = &(current_test_info_->result_);
  } else if (current_test_case_ != NULL) {
    xml_element = "testsuite";
    test_result = &(current_test_case_->ad_hoc_test_result_);
  } else {
    xml_element = "testsuites";
    test_result = &ad_hoc_test_result_;
  }
  test_result->RecordProperty(xml_element, test_property);
}